

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_blind_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uchar *value,secp256k1_generator *value_gen,secp256k1_generator *blind_gen)

{
  uint uVar1;
  int overflow2;
  int overflow;
  secp256k1_scalar sec2;
  secp256k1_scalar local_250;
  secp256k1_gej rj;
  secp256k1_ge r;
  int local_138;
  secp256k1_ge blind_genp;
  secp256k1_ge value_genp;
  secp256k1_ge bp;
  
  secp256k1_generator_load(&value_genp,value_gen);
  secp256k1_generator_load(&blind_genp,blind_gen);
  secp256k1_scalar_set_b32(&local_250,blind,&overflow);
  secp256k1_scalar_set_b32(&sec2,value,&overflow2);
  uVar1 = 0;
  if (overflow2 == 0 && overflow == 0) {
    secp256k1_ecmult_const(&rj,&value_genp,&sec2,0x100);
    secp256k1_ecmult_const((secp256k1_gej *)&r,&blind_genp,&local_250,0x100);
    if (local_138 == 0) {
      secp256k1_ge_set_gej(&bp,(secp256k1_gej *)&r);
      secp256k1_gej_add_ge(&rj,&rj,&bp);
    }
    secp256k1_gej_clear((secp256k1_gej *)&r);
    secp256k1_ge_clear(&bp);
    if (rj.infinity == 0) {
      secp256k1_ge_set_gej(&r,&rj);
      secp256k1_pedersen_commitment_save(commit,&r);
    }
    uVar1 = (uint)(rj.infinity == 0);
    secp256k1_gej_clear(&rj);
    secp256k1_ge_clear(&r);
  }
  return uVar1;
}

Assistant:

int secp256k1_pedersen_blind_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, const unsigned char *value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen) {
    secp256k1_ge value_genp;
    secp256k1_ge blind_genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    secp256k1_scalar sec2;
    int overflow;
    int overflow2;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    secp256k1_generator_load(&value_genp, value_gen);
    secp256k1_generator_load(&blind_genp, blind_gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    secp256k1_scalar_set_b32(&sec2, value, &overflow2);
    if (!overflow && !overflow2) {
        secp256k1_pedersen_blind_ecmult(&rj, &sec, &sec2, &value_genp, &blind_genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}